

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool ON_SubDEdgeSharpness::EqualEndSharpness(ON_SubDEdgePtr *eptr0,ON_SubDEdgePtr *eptr1)

{
  long lVar1;
  ON_SubDEdgeSharpness OVar2;
  ON_SubDEdgeSharpness OVar3;
  bool bVar4;
  ON_SubDEdge *edge_1;
  ulong uVar5;
  ON_SubDEdge *edge;
  ulong uVar6;
  float fStack_24;
  
  uVar6 = eptr0->m_ptr & 0xfffffffffffffff8;
  uVar5 = eptr1->m_ptr & 0xfffffffffffffff8;
  bVar4 = false;
  if (((uVar6 != uVar5) && (bVar4 = false, uVar6 != 0)) && (bVar4 = false, uVar5 != 0)) {
    if (((*(char *)(uVar6 + 0x60) == *(char *)(uVar5 + 0x60)) &&
        (lVar1 = *(long *)(uVar6 + 0x80 + (ulong)(~(uint)eptr0->m_ptr & 1) * 8), lVar1 != 0)) &&
       (lVar1 == *(long *)(uVar5 + 0x80 + (ulong)((uint)eptr1->m_ptr & 1) * 8))) {
      OVar2 = ON_SubDEdgePtr::RelativeSharpness(eptr0,true);
      OVar3 = ON_SubDEdgePtr::RelativeSharpness(eptr1,true);
      fStack_24 = OVar2.m_edge_sharpness[1];
      bVar4 = (bool)(-(fStack_24 == OVar3.m_edge_sharpness[0]) & 1);
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool ON_SubDEdgeSharpness::EqualEndSharpness(
  const class ON_SubDEdgePtr& eptr0,
  const class ON_SubDEdgePtr& eptr1
)
{
  const ON_SubDEdge* e[2] = { eptr0.Edge(), eptr1.Edge() };
  if (nullptr == e[0] || nullptr == e[1] || e[0] == e[1])
    return false;

  if (e[0]->m_edge_tag != e[1]->m_edge_tag)
    return false;

  const ON_SubDVertex* v = eptr0.RelativeVertex(1);
  if (nullptr == v)
    return false;
  if (v != eptr1.RelativeVertex(0))
    return false;

  return ON_SubDEdgeSharpness::EqualEndSharpness(eptr0.RelativeSharpness(true), eptr1.RelativeSharpness(true));
}